

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O2

void __thiscall
hdc::SymbolTableBuilderVisitor::visit
          (SymbolTableBuilderVisitor *this,VariableDeclarationStatement *statement)

{
  SymbolTable *this_00;
  int iVar1;
  IdentifierExpression *this_01;
  Type *pTVar2;
  Expression *pEVar3;
  Symbol *pSVar4;
  Variable *this_02;
  Token *token;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string sStack_48;
  
  this_01 = VariableDeclarationStatement::getName(statement);
  pTVar2 = VariableDeclarationStatement::getType(statement);
  if (pTVar2 == (Type *)0x0) {
    pTVar2 = (Type *)0x0;
  }
  else {
    pTVar2 = VariableDeclarationStatement::getType(statement);
    (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
    pTVar2 = VariableDeclarationStatement::getType(statement);
  }
  pEVar3 = VariableDeclarationStatement::getExpression(statement);
  if (pEVar3 != (Expression *)0x0) {
    pEVar3 = VariableDeclarationStatement::getExpression(statement);
    (**(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar3,this);
    if (pTVar2 == (Type *)0x0) {
      pTVar2 = this->lastType;
    }
  }
  this_00 = this->symbolTable;
  IdentifierExpression::getName_abi_cxx11_(&sStack_48,this_01);
  pSVar4 = SymbolTable::hasLocalVariableOnCurrentScope(this_00,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (pSVar4 == (Symbol *)0x0) {
    this_02 = (Variable *)operator_new(0x68);
    token = IdentifierExpression::getNameAsToken(this_01);
    LocalVariable::LocalVariable((LocalVariable *)this_02,token);
    iVar1 = (*(pTVar2->super_ASTNode)._vptr_ASTNode[3])(pTVar2);
    Variable::setType(this_02,(Type *)CONCAT44(extraout_var,iVar1));
    pSVar4 = SymbolTable::add(this->symbolTable,(LocalVariable *)this_02);
    Def::addLocalVariable(this->currentDef,(LocalVariable *)this_02);
    iVar1 = (*(pTVar2->super_ASTNode)._vptr_ASTNode[3])(pTVar2);
    Expression::setType(&this_01->super_Expression,(Type *)CONCAT44(extraout_var_00,iVar1));
    IdentifierExpression::setSymbol(this_01,pSVar4);
    pTVar2 = Expression::getType(&this_01->super_Expression);
    this->lastType = pTVar2;
    if (pTVar2 != (Type *)0x0) {
      (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
    }
    return;
  }
  std::operator<<((ostream *)&std::cout,"Error: redefinition of variable on current scope\n");
  exit(0);
}

Assistant:

void SymbolTableBuilderVisitor::visit(VariableDeclarationStatement *statement) {
    Type* type = nullptr;
    Symbol* symbol = nullptr;
    IdentifierExpression* id;

    id = statement->getName();

    if (statement->getType() != nullptr) {
        statement->getType()->accept(this);
        type = statement->getType();
    }

    if (statement->getExpression() != nullptr) {
        statement->getExpression()->accept(this);

        if (type == nullptr) {
            type = lastType;
        }
    }

    symbol = symbolTable->hasLocalVariableOnCurrentScope(id->getName());

    if (symbol == nullptr) {
        LocalVariable* var = new LocalVariable(id->getNameAsToken());
        var->setType(type->clone());
        symbol = symbolTable->add(var);
        currentDef->addLocalVariable(var);
        id->setType(type->clone());
        id->setSymbol(symbol);
        setLastType(id->getType());
    } else {
        std::cout << "Error: redefinition of variable on current scope\n";
        exit(0);
    }
}